

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O3

CaseStatementSyntax * __thiscall
slang::parsing::Parser::parseCaseStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes,Token uniqueOrPriority,
          Token caseKeyword)

{
  Token caseKeyword_00;
  Token openParen;
  Token closeParen;
  Token matchesOrInside;
  Token uniqueOrPriority_00;
  bool bVar1;
  TokenKind kind;
  undefined1 tripleAnd [16];
  bool bVar2;
  int iVar4;
  PatternSyntax *pattern;
  ExpressionSyntax *pEVar5;
  StatementSyntax *pSVar6;
  PatternCaseItemSyntax *pPVar7;
  byte bVar3;
  DefaultCaseItemSyntax *pDVar8;
  undefined8 uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  StandardCaseItemSyntax *pSVar10;
  SourceLocation SVar11;
  Diagnostic *pDVar12;
  undefined4 extraout_var_01;
  CaseStatementSyntax *pCVar13;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *pIVar14;
  TokenKind TVar15;
  TokenKind TVar16;
  ulong uVar17;
  Token TVar18;
  Token TVar19;
  Token TVar20;
  Token TVar21;
  string_view sVar22;
  bool errored;
  SourceLocation lastDefault_1;
  SourceLocation lastDefault;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  SmallVector<slang::syntax::CaseItemSyntax_*,_5UL> itemBuffer;
  SourceLocation local_278;
  SourceLocation local_270;
  Token local_268;
  uint local_254;
  SyntaxFactory *local_250;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_248;
  ulong local_238;
  undefined8 uStack_230;
  undefined8 local_220;
  Token local_210;
  Token local_200;
  undefined1 local_1f0 [24];
  undefined1 auStack_1d8 [24];
  __extent_storage<18446744073709551615UL> local_1c0;
  ExpressionSyntax *local_118;
  NamedLabelSyntax *local_110;
  undefined8 local_108;
  Info *local_100;
  Info *local_f8;
  undefined8 local_f0;
  Info *local_e8;
  undefined8 local_e0;
  pointer local_d8;
  Info *local_d0;
  SmallVectorBase<slang::syntax::CaseItemSyntax_*> local_c8 [2];
  Token local_88;
  undefined8 local_78;
  Info *pIStack_70;
  undefined8 local_68;
  Info *pIStack_60;
  Token local_58;
  undefined8 local_48;
  Info *pIStack_40;
  
  local_100 = uniqueOrPriority.info;
  local_108 = uniqueOrPriority._0_8_;
  local_d0 = (Info *)attributes._M_extent._M_extent_value;
  local_d8 = attributes._M_ptr;
  local_110 = label;
  TVar18 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  local_e8 = TVar18.info;
  local_e0 = TVar18._0_8_;
  local_118 = parseExpression(this);
  TVar18 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  local_f8 = TVar18.info;
  local_f0 = TVar18._0_8_;
  Token::Token(&local_210);
  local_c8[0].data_ = (pointer)local_c8[0].firstElement;
  local_c8[0].len = 0;
  local_c8[0].cap = 5;
  TVar18 = ParserBase::peek(&this->super_ParserBase);
  if (TVar18.kind == InsideKeyword) {
    local_210 = ParserBase::consume(&this->super_ParserBase);
    local_250 = &this->factory;
    local_278 = (SourceLocation)0x0;
    local_254 = (uint)caseKeyword.kind;
    bVar1 = false;
    do {
      while( true ) {
        while( true ) {
          TVar18 = ParserBase::peek(&this->super_ParserBase);
          TVar16 = TVar18.kind;
          if ((TVar18._0_4_ & 0xffff) != 0x86) break;
          if ((((ulong)local_278 & 0xfffffff) != 0) && (!bVar1)) {
            local_1f0._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
            SVar11 = Token::location((Token *)local_1f0);
            pDVar12 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7f0005,SVar11);
            sVar22 = LexerFacts::getTokenKindText((TokenKind)local_254);
            Diagnostic::operator<<(pDVar12,sVar22);
            bVar1 = true;
            Diagnostic::addNote(pDVar12,(DiagCode)0xa0001,local_278);
          }
          local_1f0._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
          local_278 = Token::location((Token *)local_1f0);
          pDVar8 = parseDefaultCaseItem(this);
          local_1f0._0_8_ = pDVar8;
          SmallVectorBase<slang::syntax::CaseItemSyntax*>::
          emplace_back<slang::syntax::CaseItemSyntax*>
                    ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)local_c8,
                     (CaseItemSyntax **)local_1f0);
        }
        bVar2 = slang::syntax::SyntaxFacts::isPossibleValueRangeElement(TVar16);
        if (!bVar2) break;
        Token::Token(&local_268);
        local_1f0._8_8_ = 0;
        local_1f0._0_8_ = auStack_1d8;
        local_1f0._16_8_ = (SyntaxNode *)0x8;
        TVar19 = ParserBase::peek(&this->super_ParserBase);
        local_200 = TVar19;
        bVar2 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar19.kind);
        if (bVar2) {
          bVar2 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
          if (!bVar2) {
            SVar11 = Token::location(&local_200);
            ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x580005,SVar11);
          }
          local_268 = ParserBase::expect(&this->super_ParserBase,Colon);
LAB_003bea7c:
          pIVar14 = local_268.info;
        }
        else {
          bVar2 = slang::syntax::SyntaxFacts::isPossibleValueRangeElement(TVar19.kind);
          if (bVar2) {
            pEVar5 = parseValueRangeElement
                               (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
            local_248._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar5;
            local_238 = CONCAT71(local_238._1_7_,1);
            SmallVectorBase<slang::syntax::TokenOrSyntax>::
            emplace_back<slang::syntax::TokenOrSyntax>
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1f0,
                       (TokenOrSyntax *)&local_248._M_first);
            TVar20 = ParserBase::peek(&this->super_ParserBase);
            uVar9 = TVar20._0_8_;
            bVar2 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar20.kind);
            if (TVar20.kind != EndOfFile && !bVar2) {
              do {
                if ((short)uVar9 != 0x18) {
                  ParserBase::expect(&this->super_ParserBase,Comma);
                  do {
                    bVar2 = ParserBase::
                            skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleValueRangeElement,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                      (&this->super_ParserBase,(DiagCode)0x580005,false);
                    if (!bVar2) {
                      local_268 = ParserBase::expect(&this->super_ParserBase,Colon);
                      goto LAB_003bea7c;
                    }
                    bVar2 = ParserBase::peek(&this->super_ParserBase,Comma);
                  } while (!bVar2);
                }
                local_248._M_first._M_storage =
                     (_Uninitialized<slang::parsing::Token,_true>)
                     ParserBase::expect(&this->super_ParserBase,Comma);
                local_238 = local_238 & 0xffffffffffffff00;
                SmallVectorBase<slang::syntax::TokenOrSyntax>::
                emplace_back<slang::syntax::TokenOrSyntax>
                          ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1f0,
                           (TokenOrSyntax *)&local_248._M_first);
                TVar20 = ParserBase::peek(&this->super_ParserBase);
                TVar15 = TVar20.kind;
                bVar2 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar15);
                if (TVar15 == EndOfFile || bVar2) {
                  ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
                  break;
                }
                if ((TVar19.info == TVar20.info && TVar19.kind == TVar15) &&
                   (bVar2 = ParserBase::
                            skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleValueRangeElement,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                      (&this->super_ParserBase,(DiagCode)0x580005,true), !bVar2))
                break;
                pEVar5 = parseValueRangeElement
                                   (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
                local_248._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar5;
                local_238 = CONCAT71(local_238._1_7_,1);
                SmallVectorBase<slang::syntax::TokenOrSyntax>::
                emplace_back<slang::syntax::TokenOrSyntax>
                          ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1f0,
                           (TokenOrSyntax *)&local_248._M_first);
                TVar21 = ParserBase::peek(&this->super_ParserBase);
                uVar9 = TVar21._0_8_;
                bVar2 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar21.kind);
                uVar17 = TVar20._0_8_ & 0xffffffff;
                TVar19.info = TVar20.info;
                TVar19.kind = (short)uVar17;
                TVar19._2_1_ = (char)(uVar17 >> 0x10);
                TVar19.numFlags.raw = (char)(uVar17 >> 0x18);
                TVar19.rawLen = (int)(uVar17 >> 0x20);
              } while (TVar21.kind != EndOfFile && !bVar2);
            }
            local_268 = ParserBase::expect(&this->super_ParserBase,Colon);
            goto LAB_003bea7c;
          }
          ParserBase::reportMissingList
                    (&this->super_ParserBase,TVar19,Colon,&local_268,(DiagCode)0x580005);
          pIVar14 = extraout_RDX;
        }
        iVar4 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                          ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1f0,
                           (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar14);
        TVar19 = local_268;
        local_220 = CONCAT44(extraout_var,iVar4);
        local_248._8_4_ = 3;
        local_238 = 0;
        uStack_230 = 0;
        local_248._M_rest =
             (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005cb7c0;
        pSVar6 = parseStatement(this,true,false);
        pSVar10 = slang::syntax::SyntaxFactory::standardCaseItem
                            (local_250,
                             (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                             &local_248._M_first,TVar19,&pSVar6->super_SyntaxNode);
        if ((pointer)local_1f0._0_8_ != (pointer)auStack_1d8) {
          operator_delete((void *)local_1f0._0_8_);
        }
        local_1f0._0_8_ = pSVar10;
        SmallVectorBase<slang::syntax::CaseItemSyntax*>::
        emplace_back<slang::syntax::CaseItemSyntax*>
                  ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)local_c8,
                   (CaseItemSyntax **)local_1f0);
        TVar19 = ParserBase::peek(&this->super_ParserBase);
        if (TVar18.info == TVar19.info && TVar16 == TVar19.kind) {
          ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
        }
      }
      if ((TVar16 == EndOfFile) || (bVar2 = slang::syntax::SyntaxFacts::isEndKeyword(TVar16), bVar2)
         ) goto LAB_003bf1e3;
      bVar3 = ~bVar1;
      bVar1 = true;
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar3 << 0x20 | 0x310005));
    } while( true );
  }
  if (TVar18.kind == MatchesKeyword) {
    local_210 = ParserBase::consume(&this->super_ParserBase);
    kind = caseKeyword.kind;
    local_250 = &this->factory;
    local_270 = (SourceLocation)0x0;
    bVar1 = false;
    while( true ) {
      while( true ) {
        while( true ) {
          TVar18 = ParserBase::peek(&this->super_ParserBase);
          TVar16 = TVar18.kind;
          if ((TVar18._0_4_ & 0xffff) != 0x86) break;
          if ((((ulong)local_270 & 0xfffffff) != 0) && (!bVar1)) {
            local_1f0._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
            SVar11 = Token::location((Token *)local_1f0);
            pDVar12 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7f0005,SVar11);
            sVar22 = LexerFacts::getTokenKindText(kind);
            Diagnostic::operator<<(pDVar12,sVar22);
            bVar1 = true;
            Diagnostic::addNote(pDVar12,(DiagCode)0xa0001,local_270);
          }
          local_1f0._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
          local_270 = Token::location((Token *)local_1f0);
          pDVar8 = parseDefaultCaseItem(this);
          local_1f0._0_8_ = pDVar8;
          SmallVectorBase<slang::syntax::CaseItemSyntax*>::
          emplace_back<slang::syntax::CaseItemSyntax*>
                    ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)local_c8,
                     (CaseItemSyntax **)local_1f0);
        }
        bVar2 = slang::syntax::SyntaxFacts::isPossiblePattern(TVar16);
        if (!bVar2) break;
        pattern = parsePattern(this);
        Token::Token((Token *)local_1f0);
        bVar2 = ParserBase::peek(&this->super_ParserBase,TripleAnd);
        if (bVar2) {
          local_1f0._0_16_ = (undefined1  [16])ParserBase::consume(&this->super_ParserBase);
          pEVar5 = parseExpression(this);
        }
        else {
          pEVar5 = (ExpressionSyntax *)0x0;
        }
        local_248._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Colon);
        tripleAnd = local_1f0._0_16_;
        pSVar6 = parseStatement(this,true,false);
        pPVar7 = slang::syntax::SyntaxFactory::patternCaseItem
                           (local_250,pattern,(Token)tripleAnd,pEVar5,
                            (Token)local_248._M_first._M_storage,pSVar6);
        local_1f0._0_8_ = pPVar7;
        SmallVectorBase<slang::syntax::CaseItemSyntax*>::
        emplace_back<slang::syntax::CaseItemSyntax*>
                  ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)local_c8,
                   (CaseItemSyntax **)local_1f0);
        TVar19 = ParserBase::peek(&this->super_ParserBase);
        if (TVar18.info == TVar19.info && TVar16 == TVar19.kind) {
          ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
        }
      }
      if ((TVar16 == EndOfFile) || (bVar2 = slang::syntax::SyntaxFacts::isEndKeyword(TVar16), bVar2)
         ) break;
      bVar3 = ~bVar1;
      bVar1 = true;
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar3 << 0x20 | 0x310005));
    }
LAB_003bf1e3:
    if (local_c8[0].len == 0 && !bVar1) {
      SVar11 = Token::location(&caseKeyword);
      pDVar12 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x50005,SVar11);
      sVar22 = LexerFacts::getTokenKindText(caseKeyword.kind);
      Diagnostic::operator<<(pDVar12,sVar22);
    }
    TVar19 = ParserBase::expect(&this->super_ParserBase,EndCaseKeyword);
    TVar18 = local_210;
    local_1f0._8_4_ = 1;
    local_1f0._16_8_ = (SyntaxNode *)0x0;
    auStack_1d8._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
    auStack_1d8._8_8_ = local_d0;
    auStack_1d8._16_8_ = local_d8;
    local_1c0._M_extent_value = (size_t)local_d0;
    local_1f0._0_8_ = &PTR_getChild_005c8770;
    local_48 = CONCAT62(caseKeyword._2_6_,caseKeyword.kind);
    pIStack_40 = caseKeyword.info;
    local_68 = local_e0;
    pIStack_60 = local_e8;
    local_78 = local_f0;
    pIStack_70 = local_f8;
    local_58.kind = local_210.kind;
    local_58._2_1_ = local_210._2_1_;
    local_58.numFlags.raw = local_210.numFlags.raw;
    local_58.rawLen = local_210.rawLen;
    local_58.info = local_210.info;
    local_210 = TVar18;
    iVar4 = SmallVectorBase<slang::syntax::CaseItemSyntax_*>::copy
                      (local_c8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                       (EVP_PKEY_CTX *)TVar19.info);
    local_220 = CONCAT44(extraout_var_01,iVar4);
    local_248._8_4_ = 1;
    local_238 = 0;
    uStack_230 = 0;
    local_248._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005cb6b0;
    uniqueOrPriority_00.info = local_100;
    uniqueOrPriority_00.kind = (undefined2)local_108;
    uniqueOrPriority_00._2_1_ = local_108._2_1_;
    uniqueOrPriority_00.numFlags.raw = local_108._3_1_;
    uniqueOrPriority_00.rawLen = local_108._4_4_;
    caseKeyword_00.info = pIStack_40;
    caseKeyword_00.kind = (undefined2)local_48;
    caseKeyword_00._2_1_ = local_48._2_1_;
    caseKeyword_00.numFlags.raw = local_48._3_1_;
    caseKeyword_00.rawLen = local_48._4_4_;
    openParen.info = pIStack_60;
    openParen.kind = (undefined2)local_68;
    openParen._2_1_ = local_68._2_1_;
    openParen.numFlags.raw = local_68._3_1_;
    openParen.rawLen = local_68._4_4_;
    closeParen.info = pIStack_70;
    closeParen.kind = (undefined2)local_78;
    closeParen._2_1_ = local_78._2_1_;
    closeParen.numFlags.raw = local_78._3_1_;
    closeParen.rawLen = local_78._4_4_;
    matchesOrInside.info = local_58.info;
    matchesOrInside.kind = local_58.kind;
    matchesOrInside._2_1_ = local_58._2_1_;
    matchesOrInside.numFlags.raw = local_58.numFlags.raw;
    matchesOrInside.rawLen = local_58.rawLen;
    local_88 = TVar19;
    pCVar13 = slang::syntax::SyntaxFactory::caseStatement
                        (&this->factory,local_110,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_1f0,
                         uniqueOrPriority_00,caseKeyword_00,openParen,local_118,closeParen,
                         matchesOrInside,
                         (SyntaxList<slang::syntax::CaseItemSyntax> *)&local_248._M_first,TVar19);
    if (local_c8[0].data_ != (pointer)local_c8[0].firstElement) {
      operator_delete(local_c8[0].data_);
    }
    return pCVar13;
  }
  local_250 = &this->factory;
  local_278 = (SourceLocation)0x0;
  local_254 = (uint)caseKeyword.kind;
  bVar1 = false;
  do {
    while( true ) {
      while( true ) {
        TVar18 = ParserBase::peek(&this->super_ParserBase);
        TVar16 = TVar18.kind;
        if ((TVar18._0_4_ & 0xffff) != 0x86) break;
        if ((((ulong)local_278 & 0xfffffff) != 0) && (!bVar1)) {
          local_1f0._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
          SVar11 = Token::location((Token *)local_1f0);
          pDVar12 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7f0005,SVar11);
          sVar22 = LexerFacts::getTokenKindText((TokenKind)local_254);
          Diagnostic::operator<<(pDVar12,sVar22);
          bVar1 = true;
          Diagnostic::addNote(pDVar12,(DiagCode)0xa0001,local_278);
        }
        local_1f0._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
        local_278 = Token::location((Token *)local_1f0);
        pDVar8 = parseDefaultCaseItem(this);
        local_1f0._0_8_ = pDVar8;
        SmallVectorBase<slang::syntax::CaseItemSyntax*>::
        emplace_back<slang::syntax::CaseItemSyntax*>
                  ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)local_c8,
                   (CaseItemSyntax **)local_1f0);
      }
      bVar2 = slang::syntax::SyntaxFacts::isPossibleExpression(TVar16);
      if (!bVar2) break;
      Token::Token(&local_268);
      local_1f0._8_8_ = 0;
      local_1f0._0_8_ = auStack_1d8;
      local_1f0._16_8_ = (SyntaxNode *)0x8;
      TVar20 = ParserBase::peek(&this->super_ParserBase);
      local_200 = TVar20;
      bVar2 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar20.kind);
      if (bVar2) {
        bVar2 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
        if (!bVar2) {
          SVar11 = Token::location(&local_200);
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar11);
        }
        local_268 = ParserBase::expect(&this->super_ParserBase,Colon);
LAB_003befae:
        pIVar14 = local_268.info;
      }
      else {
        bVar2 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar20.kind);
        if (bVar2) {
          pEVar5 = parseExpression(this);
          local_248._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar5;
          local_238 = CONCAT71(local_238._1_7_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1f0,
                     (TokenOrSyntax *)&local_248._M_first);
          TVar19 = ParserBase::peek(&this->super_ParserBase);
          uVar9 = TVar19._0_8_;
          bVar2 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar19.kind);
          if (TVar19.kind != EndOfFile && !bVar2) {
            do {
              if ((short)uVar9 != 0x18) {
                ParserBase::expect(&this->super_ParserBase,Comma);
                do {
                  bVar2 = ParserBase::
                          skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                    (&this->super_ParserBase,(DiagCode)0x10001,false);
                  if (!bVar2) {
                    local_268 = ParserBase::expect(&this->super_ParserBase,Colon);
                    goto LAB_003befae;
                  }
                  bVar2 = ParserBase::peek(&this->super_ParserBase,Comma);
                } while (!bVar2);
              }
              local_248._M_first._M_storage =
                   (_Uninitialized<slang::parsing::Token,_true>)
                   ParserBase::expect(&this->super_ParserBase,Comma);
              local_238 = local_238 & 0xffffffffffffff00;
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1f0,
                         (TokenOrSyntax *)&local_248._M_first);
              TVar19 = ParserBase::peek(&this->super_ParserBase);
              TVar15 = TVar19.kind;
              bVar2 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar15);
              if (TVar15 == EndOfFile || bVar2) {
                ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
                break;
              }
              if ((TVar20.info == TVar19.info && TVar20.kind == TVar15) &&
                 (bVar2 = ParserBase::
                          skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                    (&this->super_ParserBase,(DiagCode)0x10001,true), !bVar2))
              break;
              pEVar5 = parseExpression(this);
              local_248._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar5;
              local_238 = CONCAT71(local_238._1_7_,1);
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1f0,
                         (TokenOrSyntax *)&local_248._M_first);
              TVar21 = ParserBase::peek(&this->super_ParserBase);
              uVar9 = TVar21._0_8_;
              bVar2 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar21.kind);
              uVar17 = TVar19._0_8_ & 0xffffffff;
              TVar20.info = TVar19.info;
              TVar20.kind = (short)uVar17;
              TVar20._2_1_ = (char)(uVar17 >> 0x10);
              TVar20.numFlags.raw = (char)(uVar17 >> 0x18);
              TVar20.rawLen = (int)(uVar17 >> 0x20);
            } while (TVar21.kind != EndOfFile && !bVar2);
          }
          local_268 = ParserBase::expect(&this->super_ParserBase,Colon);
          goto LAB_003befae;
        }
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar20,Colon,&local_268,(DiagCode)0x10001);
        pIVar14 = extraout_RDX_00;
      }
      iVar4 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1f0,
                         (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar14);
      TVar19 = local_268;
      local_220 = CONCAT44(extraout_var_00,iVar4);
      local_248._8_4_ = 3;
      local_238 = 0;
      uStack_230 = 0;
      local_248._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005cb7c0
      ;
      pSVar6 = parseStatement(this,true,false);
      pSVar10 = slang::syntax::SyntaxFactory::standardCaseItem
                          (local_250,
                           (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                           &local_248._M_first,TVar19,&pSVar6->super_SyntaxNode);
      if ((pointer)local_1f0._0_8_ != (pointer)auStack_1d8) {
        operator_delete((void *)local_1f0._0_8_);
      }
      local_1f0._0_8_ = pSVar10;
      SmallVectorBase<slang::syntax::CaseItemSyntax*>::emplace_back<slang::syntax::CaseItemSyntax*>
                ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)local_c8,
                 (CaseItemSyntax **)local_1f0);
      TVar19 = ParserBase::peek(&this->super_ParserBase);
      if (TVar18.info == TVar19.info && TVar16 == TVar19.kind) {
        ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
      }
    }
    if ((TVar16 == EndOfFile) || (bVar2 = slang::syntax::SyntaxFacts::isEndKeyword(TVar16), bVar2))
    goto LAB_003bf1e3;
    bVar3 = ~bVar1;
    bVar1 = true;
    ParserBase::skipToken
              (&this->super_ParserBase,(optional<slang::DiagCode>)((uint6)bVar3 << 0x20 | 0x310005))
    ;
  } while( true );
}

Assistant:

CaseStatementSyntax& Parser::parseCaseStatement(NamedLabelSyntax* label, AttrList attributes,
                                                Token uniqueOrPriority, Token caseKeyword) {
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& caseExpr = parseExpression();
    auto closeParen = expect(TokenKind::CloseParenthesis);

    Token matchesOrInside;
    SmallVector<CaseItemSyntax*> itemBuffer;
    bool errored = false;

    switch (peek().kind) {
        case TokenKind::MatchesKeyword:
            // pattern matching case statement
            matchesOrInside = consume();
            errored = parseCaseItems(
                caseKeyword.kind, itemBuffer, [](auto kind) { return isPossiblePattern(kind); },
                [this] {
                    auto& pattern = parsePattern();
                    Token tripleAnd;
                    ExpressionSyntax* patternExpr = nullptr;

                    if (peek(TokenKind::TripleAnd)) {
                        tripleAnd = consume();
                        patternExpr = &parseExpression();
                    }

                    auto colon = expect(TokenKind::Colon);
                    return &factory.patternCaseItem(pattern, tripleAnd, patternExpr, colon,
                                                    parseStatement());
                });
            break;
        case TokenKind::InsideKeyword:
            // range checking case statement
            matchesOrInside = consume();
            errored = parseCaseItems(
                caseKeyword.kind, itemBuffer,
                [](auto kind) { return isPossibleValueRangeElement(kind); },
                [this] {
                    Token colon;
                    SmallVector<TokenOrSyntax, 8> buffer;

                    parseList<isPossibleValueRangeElement, isEndOfCaseItem>(
                        buffer, TokenKind::Colon, TokenKind::Comma, colon, RequireItems::True,
                        diag::ExpectedValueRangeElement,
                        [this] { return &parseValueRangeElement(); });
                    return &factory.standardCaseItem(buffer.copy(alloc), colon, parseStatement());
                });
            break;
        default:
            // normal case statement
            errored = parseCaseItems(
                caseKeyword.kind, itemBuffer, [](auto kind) { return isPossibleExpression(kind); },
                [this] {
                    Token colon;
                    SmallVector<TokenOrSyntax, 8> buffer;

                    parseList<isPossibleExpressionOrComma, isEndOfCaseItem>(
                        buffer, TokenKind::Colon, TokenKind::Comma, colon, RequireItems::True,
                        diag::ExpectedExpression, [this] { return &parseExpression(); });
                    return &factory.standardCaseItem(buffer.copy(alloc), colon, parseStatement());
                });
            break;
    }

    if (itemBuffer.empty() && !errored) {
        addDiag(diag::CaseStatementEmpty, caseKeyword.location())
            << LexerFacts::getTokenKindText(caseKeyword.kind);
    }

    auto endcase = expect(TokenKind::EndCaseKeyword);
    return factory.caseStatement(label, attributes, uniqueOrPriority, caseKeyword, openParen,
                                 caseExpr, closeParen, matchesOrInside, itemBuffer.copy(alloc),
                                 endcase);
}